

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int checksum_final(archive_read *a,void *a_sum_val,size_t a_sum_len,void *e_sum_val,size_t e_sum_len
                  )

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = a->format->data;
  iVar2 = _checksum_final((chksumwork *)((long)pvVar1 + 0x170),a_sum_val,a_sum_len);
  if ((iVar2 == 0) &&
     (iVar2 = _checksum_final((chksumwork *)((long)pvVar1 + 0x188),e_sum_val,e_sum_len), iVar2 == 0)
     ) {
    return 0;
  }
  archive_set_error(&a->archive,-1,"Sumcheck error");
  return iVar2;
}

Assistant:

static int
checksum_final(struct archive_read *a, const void *a_sum_val,
    size_t a_sum_len, const void *e_sum_val, size_t e_sum_len)
{
	struct xar *xar;
	int r;

	xar = (struct xar *)(a->format->data);
	r = _checksum_final(&(xar->a_sumwrk), a_sum_val, a_sum_len);
	if (r == ARCHIVE_OK)
		r = _checksum_final(&(xar->e_sumwrk), e_sum_val, e_sum_len);
	if (r != ARCHIVE_OK)
		archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
		    "Sumcheck error");
	return (r);
}